

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

void __thiscall State::State(State *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->paths_)._M_h._M_buckets = &(this->paths_)._M_h._M_single_bucket;
  (this->paths_)._M_h._M_bucket_count = 1;
  (this->paths_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->paths_)._M_h._M_element_count = 0;
  (this->paths_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->paths_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->paths_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->pools_)._M_t._M_impl.super__Rb_tree_header;
  (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pools_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->bindings_).super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_0012ccf0;
  p_Var1 = &(this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bindings_).bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindings_).rules_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bindings_).parent_ = (BindingEnv *)0x0;
  BindingEnv::AddRule(&this->bindings_,&kPhonyRule);
  AddPool(this,&kDefaultPool);
  AddPool(this,&kConsolePool);
  return;
}

Assistant:

State::State() {
  bindings_.AddRule(&kPhonyRule);
  AddPool(&kDefaultPool);
  AddPool(&kConsolePool);
}